

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
* __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::Take
          (IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          ,size_t count)

{
  vector<int,_std::allocator<int>_> local_68;
  int *local_50;
  int *piStack_48;
  size_t local_40;
  size_t sStack_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_68,&(this->source).source);
  local_50 = (this->source).current._M_current;
  piStack_48 = (this->source).end._M_current;
  (__return_storage_ptr__->source).super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_001583f8;
  (__return_storage_ptr__->source).source.super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_00157230;
  sStack_38 = count;
  std::vector<int,_std::allocator<int>_>::vector
            (&(__return_storage_ptr__->source).source.source,&local_68);
  (__return_storage_ptr__->source).source.current._M_current = local_50;
  (__return_storage_ptr__->source).source.end._M_current = piStack_48;
  (__return_storage_ptr__->source).current = local_40;
  (__return_storage_ptr__->source).count = sStack_38;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Take(size_t count) 
		{ 
			return IEnumerableCore<TakeState<S, T>>(
				TakeState<S, T>(std::move(source), count)
			);
		}